

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_instance_cache.cpp
# Opt level: O2

shared_ptr<duckdb::DuckDB,_true> __thiscall
duckdb::DBInstanceCache::CreateInstanceInternal
          (DBInstanceCache *this,string *database,DBConfig *config,bool cache_instance,
          function<void_(duckdb::DuckDB_&)> *on_create)

{
  element_type *peVar1;
  type pFVar2;
  iterator iVar3;
  long lVar4;
  __weak_ptr<duckdb::DuckDB,(__gnu_cxx::_Lock_policy)2> *this_00;
  __weak_ptr<duckdb::DatabaseCacheEntry,(__gnu_cxx::_Lock_policy)2> *this_01;
  type __args;
  Exception *this_02;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer *__ptr;
  function<void_(duckdb::DuckDB_&)> *in_R9;
  shared_ptr<duckdb::DuckDB,_true> sVar5;
  shared_ptr<duckdb::DatabaseCacheEntry,_true> cache_entry;
  string instance_path;
  string abs_database_path;
  shared_ptr<duckdb::DatabaseCacheEntry,_true> local_40;
  
  peVar1 = (element_type *)CONCAT71(in_register_00000009,cache_instance);
  abs_database_path._M_dataplus._M_p = (pointer)&abs_database_path.field_2;
  abs_database_path._M_string_length = 0;
  abs_database_path.field_2._M_local_buf[0] = '\0';
  if (*(long *)(CONCAT71(in_register_00000009,cache_instance) + 0x78) == 0) {
    FileSystem::CreateLocal();
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                        *)&cache_entry);
    GetDBAbsolutePath(&instance_path,(string *)config,pFVar2);
    ::std::__cxx11::string::operator=((string *)&abs_database_path,(string *)&instance_path);
    ::std::__cxx11::string::~string((string *)&instance_path);
    if (cache_entry.internal.
        super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(code *)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&((((cache_entry.internal.
                            super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->database).internal.
                          super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        instance).internal.
                        super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2> + 8
                ))->_M_pi)();
    }
  }
  else {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                        *)&peVar1[7].database.internal.
                           super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    GetDBAbsolutePath(&instance_path,(string *)config,pFVar2);
    ::std::__cxx11::string::operator=((string *)&abs_database_path,(string *)&instance_path);
    ::std::__cxx11::string::~string((string *)&instance_path);
  }
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)database,&abs_database_path);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    ::std::__cxx11::string::string((string *)&instance_path,(string *)&abs_database_path);
    lVar4 = ::std::__cxx11::string::rfind((char *)&abs_database_path,0xf86aae);
    if (lVar4 == 0) {
      ::std::__cxx11::string::assign((char *)&instance_path);
    }
    cache_entry.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    cache_entry.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((char)on_create != '\0') {
      make_shared_ptr<duckdb::DatabaseCacheEntry>();
      shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator=(&cache_entry,&local_40);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.internal.
                  super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator=
                ((shared_ptr<duckdb::DatabaseCacheEntry,_true> *)
                 &peVar1[0x65].database.internal.
                  super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &cache_entry);
    }
    local_40.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    make_shared_ptr<duckdb::DuckDB,std::__cxx11::string&,duckdb::DBConfig*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (DBConfig **)&instance_path);
    if (cache_entry.internal.
        super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_00 = (__weak_ptr<duckdb::DuckDB,(__gnu_cxx::_Lock_policy)2> *)
                shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator->(&cache_entry);
      ::std::__weak_ptr<duckdb::DuckDB,(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2> *)this);
      this_01 = (__weak_ptr<duckdb::DatabaseCacheEntry,(__gnu_cxx::_Lock_policy)2> *)
                ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)database,&abs_database_path);
      ::std::__weak_ptr<duckdb::DatabaseCacheEntry,(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,(__shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2> *)
                         &cache_entry);
    }
    if ((in_R9->super__Function_base)._M_manager != (_Manager_type)0x0) {
      __args = shared_ptr<duckdb::DuckDB,_true>::operator*((shared_ptr<duckdb::DuckDB,_true> *)this)
      ;
      ::std::function<void_(duckdb::DuckDB_&)>::operator()(in_R9,__args);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cache_entry.internal.
                super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__cxx11::string::~string((string *)&instance_path);
    ::std::__cxx11::string::~string((string *)&abs_database_path);
    sVar5.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    sVar5.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::DuckDB,_true>)
           sVar5.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_02 = (Exception *)__cxa_allocate_exception(0x10);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cache_entry
                   ,"Instance with path: ",&abs_database_path);
  ::std::operator+(&instance_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cache_entry
                   ," already exists.");
  Exception::Exception(this_02,CONNECTION,&instance_path);
  __cxa_throw(this_02,&Exception::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<DuckDB> DBInstanceCache::CreateInstanceInternal(const string &database, DBConfig &config,
                                                           bool cache_instance,
                                                           const std::function<void(DuckDB &)> &on_create) {
	string abs_database_path;
	if (config.file_system) {
		abs_database_path = GetDBAbsolutePath(database, *config.file_system);
	} else {
		auto tmp_fs = FileSystem::CreateLocal();
		abs_database_path = GetDBAbsolutePath(database, *tmp_fs);
	}
	if (db_instances.find(abs_database_path) != db_instances.end()) {
		throw duckdb::Exception(ExceptionType::CONNECTION,
		                        "Instance with path: " + abs_database_path + " already exists.");
	}
	// Creates new instance
	string instance_path = abs_database_path;
	if (abs_database_path.rfind(IN_MEMORY_PATH, 0) == 0) {
		instance_path = IN_MEMORY_PATH;
	}
	shared_ptr<DatabaseCacheEntry> cache_entry;
	if (cache_instance) {
		cache_entry = make_shared_ptr<DatabaseCacheEntry>();
		config.db_cache_entry = cache_entry;
	}
	auto db_instance = make_shared_ptr<DuckDB>(instance_path, &config);
	if (cache_entry) {
		// attach cache entry to the database
		cache_entry->database = db_instance;

		// cache the entry in the db_instances map
		db_instances[abs_database_path] = cache_entry;
	}
	if (on_create) {
		on_create(*db_instance);
	}
	return db_instance;
}